

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O2

void __thiscall Example::initializeUniverse(Example *this)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  Example *pEVar1;
  S_Polyhedron *this_01;
  STP_BV *this_02;
  STP_BV *this_03;
  double local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  Example *local_38;
  
  this_01 = (S_Polyhedron *)operator_new(0xf0);
  sch::S_Polyhedron::S_Polyhedron(this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"sample_polyhedron.otp",(allocator<char> *)&local_70);
  (**(code **)(*(long *)this_01 + 0x30))(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_68._M_dataplus._M_p = (pointer)0x3fb999999999999a;
  local_70 = 0.7;
  local_48 = 0x3feccccccccccccd;
  sch::S_Object::setPosition((double *)this_01,(double *)&local_68,&local_70);
  local_68._M_dataplus._M_p = (pointer)0x3fb999999999999a;
  local_70 = 1.0;
  local_48 = 0xbfe6666666666666;
  sch::S_Object::setOrientation((double *)this_01,(double *)&local_68,&local_70);
  sch::CD_Scene::addObject((S_Object *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"poly",(allocator<char> *)&local_70);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->objName,
             &local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this_02 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(this_02);
  this_03 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(this_03);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"sample_stpbv1.txt",(allocator<char> *)&local_70);
  (**(code **)(*(long *)this_02 + 0x30))(this_02,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"sample_stpbv2.txt",(allocator<char> *)&local_70);
  local_40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->objName;
  local_38 = this;
  (**(code **)(*(long *)this_03 + 0x30))(this_03,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  local_68._M_dataplus._M_p = (pointer)0x3fc3333333333333;
  local_70 = 0.6;
  local_48 = 0x3fe999999999999a;
  sch::S_Object::setPosition((double *)this_02,(double *)&local_68,&local_70);
  local_68._M_dataplus._M_p = (pointer)0x3fd999999999999a;
  local_70 = -1.1;
  local_48 = 0x3ff3333333333333;
  sch::S_Object::setOrientation((double *)this_02,(double *)&local_68,&local_70);
  local_68._M_dataplus._M_p = (pointer)0x3fd999999999999a;
  local_70 = 0.0;
  local_48 = 0x3fb999999999999a;
  sch::S_Object::setPosition((double *)this_03,(double *)&local_68,&local_70);
  local_68._M_dataplus._M_p = (pointer)0x3fe6666666666666;
  local_70 = -0.2;
  local_48 = 0xbff199999999999a;
  sch::S_Object::setOrientation((double *)this_03,(double *)&local_68,&local_70);
  pEVar1 = local_38;
  sch::CD_Scene::addObject((S_Object *)local_38);
  sch::CD_Scene::addObject((S_Object *)pEVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"stp1",(allocator<char> *)&local_70);
  this_00 = local_40;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_40,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"stp2",(allocator<char> *)&local_70);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void Example::initializeUniverse()
{
  //Scene (see example1.exe)

  //**********
  //Polyhedrons

  //Create a polyhedron.
  S_Polyhedron * poly = new S_Polyhedron ();

  //At creationm the polyhedron is empty, it has to be loaded from a file.
  poly->constructFromFile("sample_polyhedron.otp");

  //The file must have been generated with sch-creator, for details see
  //https://github.com/jrl-umi3218/sch-creator

  //An elternative solution is to use qconvex software from Qhull using the
  //following instruction:
  //"qconvex.exe TI <input_filename> TO <output_filename> Qt o f"
  //see http://www.qhull.org/html/qconvex.htm for details on using qconvex.

  //Position/Orientation
  poly->setPosition(0.1,0.7,0.9);
  poly->setOrientation(0.1,1,-0.7);

  //Add to scene
  sObj.addObject(poly);
  objName.push_back("poly");

  //*********
  //Strictly Convex Hull (STP-BV)
  //(see README.md for details)

  //Create a STP_BVs
  STP_BV* stp1 = new STP_BV();
  STP_BV* stp2 = new STP_BV();

  //Similarly to polyhedrons, it has to be loaded from file
  stp1->constructFromFile("sample_stpbv1.txt");
  stp2->constructFromFile("sample_stpbv2.txt");


  //Position/Orientation
  stp1->setPosition(0.15,0.6,0.8);
  stp1->setOrientation(0.4,-1.1,1.2);

  //Position/Orientation
  stp2->setPosition(0.4,0.0,0.1);
  stp2->setOrientation(0.7,-0.2,-1.1);

  //Add to scene
  sObj.addObject(stp1);
  sObj.addObject(stp2);
  objName.push_back("stp1");
  objName.push_back("stp2");
}